

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,cmLocalGenerator *lg,string *config,
          string *lang,cmCompiledGeneratorExpression *inputExpression,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputFiles,mode_t perm)

{
  iterator iVar1;
  bool bVar2;
  __type _Var3;
  byte bVar4;
  pointer pcVar5;
  string *psVar6;
  cmGeneratorTarget *headTarget;
  ulong uVar7;
  pointer ppVar8;
  ostream *poVar9;
  cmMakefile *this_00;
  mapped_type *this_01;
  char *file;
  bool local_831;
  undefined1 local_830 [7];
  bool hasNewLine;
  string line;
  istringstream iss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  undefined1 local_670 [8];
  cmGeneratedFileStream fout;
  undefined1 local_400 [7];
  bool openWithBinaryFlag;
  undefined1 local_3e0 [8];
  ostringstream e_1;
  _Self local_268;
  _Self local_260;
  iterator it;
  string *outputContent;
  string outputFileName;
  undefined1 local_210 [8];
  ostringstream e;
  undefined1 local_90 [8];
  string condResult;
  cmGeneratorTarget *target;
  string rawCondition;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *outputFiles_local;
  cmCompiledGeneratorExpression *inputExpression_local;
  string *lang_local;
  string *config_local;
  cmLocalGenerator *lg_local;
  cmGeneratorExpressionEvaluationFile *this_local;
  
  rawCondition.field_2._8_8_ = outputFiles;
  pcVar5 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->(&this->Condition);
  psVar6 = cmCompiledGeneratorExpression::GetInput_abi_cxx11_(pcVar5);
  std::__cxx11::string::string((string *)&target,(string *)psVar6);
  headTarget = cmLocalGenerator::FindGeneratorTargetToUse(lg,&this->Target);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    pcVar5 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->(&this->Condition);
    psVar6 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar5,lg,config,headTarget,(cmGeneratorExpressionDAGChecker *)0x0,
                        (cmGeneratorTarget *)0x0,lang);
    std::__cxx11::string::string((string *)local_90,(string *)psVar6);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,"0");
    if (bVar2) {
      bVar2 = true;
    }
    else {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"1");
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
        poVar9 = std::operator<<((ostream *)local_210,"Evaluation file condition \"");
        poVar9 = std::operator<<(poVar9,(string *)&target);
        poVar9 = std::operator<<(poVar9,"\" did not evaluate to valid content. Got \"");
        poVar9 = std::operator<<(poVar9,(string *)local_90);
        std::operator<<(poVar9,"\".");
        std::__cxx11::ostringstream::str();
        cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,(string *)((long)&outputFileName.field_2 + 8))
        ;
        std::__cxx11::string::~string((string *)(outputFileName.field_2._M_local_buf + 8));
        bVar2 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
      }
      else {
        bVar2 = false;
      }
    }
    std::__cxx11::string::~string((string *)local_90);
    if (bVar2) goto LAB_0097bade;
  }
  GetOutputFileName((string *)&outputContent,this,lg,headTarget,config,lang);
  it._M_node = (_Base_ptr)
               cmCompiledGeneratorExpression::Evaluate
                         (inputExpression,lg,config,headTarget,
                          (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,lang);
  local_260._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)rawCondition.field_2._8_8_,(key_type *)&outputContent);
  local_268._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)rawCondition.field_2._8_8_);
  bVar2 = std::operator!=(&local_260,&local_268);
  if (bVar2) {
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_260);
    _Var3 = std::operator==(&ppVar8->second,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            it._M_node);
    if (!_Var3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
      poVar9 = std::operator<<((ostream *)local_3e0,
                               "Evaluation file to be written multiple times with different content. This is generally caused by the content evaluating the configuration type, language, or location of object files:\n "
                              );
      std::operator<<(poVar9,(string *)&outputContent);
      std::__cxx11::ostringstream::str();
      cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,(string *)local_400);
      std::__cxx11::string::~string((string *)local_400);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
    }
  }
  else {
    this_00 = cmLocalGenerator::GetMakefile(lg);
    cmMakefile::AddCMakeOutputFile(this_00,(string *)&outputContent);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Files,(value_type *)&outputContent);
    iVar1 = it;
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)rawCondition.field_2._8_8_,(key_type *)&outputContent);
    std::__cxx11::string::operator=((string *)this_01,(string *)iVar1._M_node);
    fout._615_1_ = 0;
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      fout._615_1_ = 1;
    }
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_670,None);
    cmGeneratedFileStream::Open
              ((cmGeneratedFileStream *)local_670,(string *)&outputContent,false,
               (bool)(fout._615_1_ & 1));
    bVar4 = std::ios::operator!((ios *)(local_670 + (long)*(_func_int **)((long)local_670 + -0x18)))
    ;
    if ((bVar4 & 1) == 0) {
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_670,true);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)(line.field_2._M_local_buf + 8),(string *)it._M_node,_S_in);
      std::__cxx11::string::string((string *)local_830);
      local_831 = false;
      while (bVar2 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)((long)&line.field_2 + 8),(string *)local_830,&local_831,
                                0xffffffffffffffff), bVar2) {
        std::operator<<((ostream *)local_670,(string *)local_830);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::operator<<((ostream *)local_670,(string *)&this->NewLineCharacter);
        }
        else if ((local_831 & 1U) != 0) {
          std::operator<<((ostream *)local_670,"\n");
        }
      }
      bVar2 = cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_670);
      if ((bVar2) && (perm != 0)) {
        file = (char *)std::__cxx11::string::c_str();
        cmsys::SystemTools::SetPermissions(file,perm,false);
      }
      std::__cxx11::string::~string((string *)local_830);
      std::__cxx11::istringstream::~istringstream((istringstream *)(line.field_2._M_local_buf + 8));
    }
    else {
      std::operator+(&local_690,"Could not open file for write in copy operation ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &outputContent);
      cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,&local_690);
      std::__cxx11::string::~string((string *)&local_690);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_670);
  }
  std::__cxx11::string::~string((string *)&outputContent);
LAB_0097bade:
  std::__cxx11::string::~string((string *)&target);
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(
  cmLocalGenerator* lg, const std::string& config, const std::string& lang,
  cmCompiledGeneratorExpression* inputExpression,
  std::map<std::string, std::string>& outputFiles, mode_t perm)
{
  std::string rawCondition = this->Condition->GetInput();
  cmGeneratorTarget* target = lg->FindGeneratorTargetToUse(this->Target);
  if (!rawCondition.empty()) {
    std::string condResult =
      this->Condition->Evaluate(lg, config, target, nullptr, nullptr, lang);
    if (condResult == "0") {
      return;
    }
    if (condResult != "1") {
      std::ostringstream e;
      e << "Evaluation file condition \"" << rawCondition
        << "\" did "
           "not evaluate to valid content. Got \""
        << condResult << "\".";
      lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }

  const std::string outputFileName =
    this->GetOutputFileName(lg, target, config, lang);
  const std::string& outputContent =
    inputExpression->Evaluate(lg, config, target, nullptr, nullptr, lang);

  auto it = outputFiles.find(outputFileName);

  if (it != outputFiles.end()) {
    if (it->second == outputContent) {
      return;
    }
    std::ostringstream e;
    e << "Evaluation file to be written multiple times with different "
         "content. "
         "This is generally caused by the content evaluating the "
         "configuration type, language, or location of object files:\n "
      << outputFileName;
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  lg->GetMakefile()->AddCMakeOutputFile(outputFileName);
  this->Files.push_back(outputFileName);
  outputFiles[outputFileName] = outputContent;

  bool openWithBinaryFlag = false;
  if (!this->NewLineCharacter.empty()) {
    openWithBinaryFlag = true;
  }
  cmGeneratedFileStream fout;
  fout.Open(outputFileName, false, openWithBinaryFlag);
  if (!fout) {
    lg->IssueMessage(MessageType::FATAL_ERROR,
                     "Could not open file for write in copy operation " +
                       outputFileName);
    return;
  }
  fout.SetCopyIfDifferent(true);
  std::istringstream iss(outputContent);
  std::string line;
  bool hasNewLine = false;
  while (cmSystemTools::GetLineFromStream(iss, line, &hasNewLine)) {
    fout << line;
    if (!this->NewLineCharacter.empty()) {
      fout << this->NewLineCharacter;
    } else if (hasNewLine) {
      // if new line character is not specified, the file will be opened in
      // text mode. So, "\n" will be translated to the correct newline
      // ending based on the platform.
      fout << "\n";
    }
  }
  if (fout.Close() && perm) {
    cmSystemTools::SetPermissions(outputFileName.c_str(), perm);
  }
}